

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_0::PartialResponseService::~PartialResponseService(PartialResponseService *this)

{
  HttpHeaderTable::~HttpHeaderTable(&this->table);
  if ((this->exception).ptr.isSet == true) {
    Exception::~Exception(&(this->exception).ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo", 3);
      return promise.attach(kj::mv(body)).then([]() -> kj::Promise<void> {
        return KJ_EXCEPTION(FAILED, "failed");
      });
    });
  }